

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentVariableReporter.cpp
# Opt level: O0

bool __thiscall
ApprovalTests::EnvironmentVariableReporter::report
          (EnvironmentVariableReporter *this,string *envVar,string *received,string *approved)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  runtime_error *prVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *in_RCX;
  string *in_RDX;
  string message_1;
  bool reporter_worked;
  string message;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  known;
  unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_> reporter;
  string local_120 [24];
  ReporterFactory *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff20;
  ReporterFactory *in_stack_ffffffffffffff28;
  string local_c0 [39];
  byte local_99;
  string local_98 [32];
  string local_78 [80];
  string *local_28;
  string *local_20;
  byte local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    ReporterFactory::createReporter(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    ReporterFactory::allSupportedReporterNames_abi_cxx11_(in_stack_fffffffffffffef8);
    bVar1 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>
                        *)0x1df5b8);
    if (!bVar1) {
      environmentVariableName_abi_cxx11_();
      HelpMessages::getUnknownEnvVarReporterHelp
                (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffef8);
      ::std::__cxx11::string::~string(local_98);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar4,local_78);
      __cxa_throw(prVar4,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)::std::
                 unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>
                 ::operator->((unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>
                               *)0x1df6ef);
    ::std::__cxx11::string::string(local_c0,local_20);
    ::std::__cxx11::string::string((string *)&stack0xffffffffffffff20,local_28);
    uVar2 = (*(code *)(((this_00->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->field_2)._M_allocated_capacity)
                      (this_00,local_c0,&stack0xffffffffffffff20);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
    ::std::__cxx11::string::~string(local_c0);
    local_99 = (byte)uVar2 & 1;
    if ((uVar2 & 1) == 0) {
      environmentVariableName_abi_cxx11_();
      HelpMessages::getInvalidEnvVarReporterHelp
                (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffef8);
      ::std::__cxx11::string::~string(local_120);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar4,(string *)&stack0xffffffffffffff00);
      __cxa_throw(prVar4,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_1 = local_99;
    Catch::clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_00);
    ::std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>::
    ~unique_ptr((unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>
                 *)this_00);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool EnvironmentVariableReporter::report(const std::string& envVar,
                                             const std::string& received,
                                             const std::string& approved) const
    {
        if (envVar.empty())
        {
            return false;
        }

        auto reporter = factory.createReporter(envVar);
        auto known = factory.allSupportedReporterNames();

        if (!reporter)
        {
            auto message = HelpMessages::getUnknownEnvVarReporterHelp(
                EnvironmentVariableReporter::environmentVariableName(), envVar, known);
            throw std::runtime_error(message);
        }

        auto reporter_worked = reporter->report(received, approved);

        if (!reporter_worked)
        {
            auto message = HelpMessages::getInvalidEnvVarReporterHelp(
                EnvironmentVariableReporter::environmentVariableName(), envVar, known);
            throw std::runtime_error(message);
        }

        return reporter_worked;
    }